

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

void __thiscall tinyxml2::MemPoolT<112>::~MemPoolT(MemPoolT<112> *this)

{
  ~MemPoolT(this);
  operator_delete(this);
  return;
}

Assistant:

~MemPoolT() {
        MemPoolT< ITEM_SIZE >::Clear();
    }